

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTransaction::AddTxIn
          (AbstractTransaction *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  uint32_t sequence_00;
  uint32_t utxo_index;
  bool bVar2;
  uchar *puVar3;
  size_type sVar4;
  uchar *script;
  size_type script_len;
  CfdException *this_00;
  allocator local_e9;
  string local_e8;
  CfdSourceLocation local_c8;
  ByteData local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_data;
  int ret;
  ByteData local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *txid_buf;
  wally_tx *tx_pointer;
  Script *unlocking_script_local;
  uint32_t sequence_local;
  uint32_t index_local;
  Txid *txid_local;
  AbstractTransaction *this_local;
  
  txid_buf = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this->wally_tx_pointer_;
  tx_pointer = (wally_tx *)unlocking_script;
  unlocking_script_local._0_4_ = sequence;
  unlocking_script_local._4_4_ = index;
  _sequence_local = txid;
  txid_local = (Txid *)this;
  Txid::GetData(&local_68,txid);
  ByteData::GetBytes(&local_50,&local_68);
  ByteData::~ByteData(&local_68);
  local_38 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50;
  bVar2 = Script::IsEmpty((Script *)tx_pointer);
  pvVar1 = txid_buf;
  if (bVar2) {
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_38);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
    script_data._0_4_ =
         wally_tx_add_raw_input
                   ((wally_tx *)pvVar1,puVar3,sVar4,unlocking_script_local._4_4_,
                    (uint32_t)unlocking_script_local,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,0)
    ;
  }
  else {
    Script::GetData(&local_b0,(Script *)tx_pointer);
    ByteData::GetBytes(&local_98,&local_b0);
    ByteData::~ByteData(&local_b0);
    pvVar1 = txid_buf;
    local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98;
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_38);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
    utxo_index = unlocking_script_local._4_4_;
    sequence_00 = (uint32_t)unlocking_script_local;
    script = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_80);
    script_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_80);
    script_data._0_4_ =
         wally_tx_add_raw_input
                   ((wally_tx *)pvVar1,puVar3,sVar4,utxo_index,sequence_00,script,script_len,
                    (wally_tx_witness_stack *)0x0,0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
  }
  if ((int)script_data != 0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x17e;
    local_c8.funcname = "AddTxIn";
    logger::warn<int&>(&local_c8,"wally_tx_add_raw_input NG[{}].",(int *)&script_data);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_e8,"txin add error.",&local_e9);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_e8);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  return;
}

Assistant:

void AbstractTransaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &txid_buf = txid.GetData().GetBytes();
  int ret;
  if (unlocking_script.IsEmpty()) {
    ret = wally_tx_add_raw_input(
        tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence, NULL, 0,
        NULL, 0);
  } else {
    const std::vector<uint8_t> &script_data =
        unlocking_script.GetData().GetBytes();
    ret = wally_tx_add_raw_input(
        tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence,
        script_data.data(), script_data.size(), NULL, 0);
  }
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_raw_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }
}